

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O3

void fiat_id_tc26_gost_3410_2012_512_paramSetC_add(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  
  uVar1 = arg1[1];
  uVar2 = arg1[2];
  uVar3 = arg1[3];
  uVar4 = arg1[4];
  uVar5 = arg1[5];
  uVar6 = arg1[6];
  uVar7 = arg1[7];
  uVar8 = arg2[1];
  uVar9 = arg2[2];
  uVar10 = arg2[3];
  uVar11 = arg2[4];
  uVar12 = arg2[5];
  uVar13 = arg2[6];
  uVar14 = arg2[7];
  uVar15 = arg1[8];
  uVar16 = arg1[9];
  uVar17 = arg2[8];
  uVar18 = arg2[9];
  *out1 = *arg2 + *arg1;
  out1[1] = uVar8 + uVar1;
  out1[2] = uVar9 + uVar2;
  out1[3] = uVar10 + uVar3;
  out1[4] = uVar11 + uVar4;
  out1[5] = uVar12 + uVar5;
  out1[6] = uVar13 + uVar6;
  out1[7] = uVar14 + uVar7;
  out1[8] = uVar17 + uVar15;
  out1[9] = uVar18 + uVar16;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetC_add(
    uint64_t out1[10], const uint64_t arg1[10], const uint64_t arg2[10]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    x1 = ((arg1[0]) + (arg2[0]));
    x2 = ((arg1[1]) + (arg2[1]));
    x3 = ((arg1[2]) + (arg2[2]));
    x4 = ((arg1[3]) + (arg2[3]));
    x5 = ((arg1[4]) + (arg2[4]));
    x6 = ((arg1[5]) + (arg2[5]));
    x7 = ((arg1[6]) + (arg2[6]));
    x8 = ((arg1[7]) + (arg2[7]));
    x9 = ((arg1[8]) + (arg2[8]));
    x10 = ((arg1[9]) + (arg2[9]));
    out1[0] = x1;
    out1[1] = x2;
    out1[2] = x3;
    out1[3] = x4;
    out1[4] = x5;
    out1[5] = x6;
    out1[6] = x7;
    out1[7] = x8;
    out1[8] = x9;
    out1[9] = x10;
}